

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

int __thiscall sentencepiece::SentencePieceProcessor::GetPieceSize(SentencePieceProcessor *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pMVar5;
  Status local_38;
  byte local_2e;
  Die local_2d [13];
  Status local_20;
  SentencePieceProcessor *local_18;
  SentencePieceProcessor *this_local;
  
  local_18 = this;
  (*this->_vptr_SentencePieceProcessor[7])();
  bVar1 = util::Status::ok(&local_20);
  util::Status::~Status(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pMVar5 = std::
             unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
             ::operator->(&this->model_);
    this_local._4_4_ = (*pMVar5->_vptr_ModelInterface[0x10])();
  }
  else {
    iVar2 = logging::GetMinLogLevel();
    local_2e = 0;
    if (iVar2 < 3) {
      error::Die::Die(local_2d,false);
      local_2e = 1;
      pcVar3 = logging::BaseName("src/sentencepiece_processor.cc");
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3ba);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"ERROR");
      poVar4 = std::operator<<(poVar4,") ");
      (*this->_vptr_SentencePieceProcessor[7])(&local_38);
      pcVar3 = util::Status::message(&local_38);
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\nReturns default value ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
      error::Die::operator&(local_2d,poVar4);
      util::Status::~Status(&local_38);
    }
    if ((local_2e & 1) != 0) {
      error::Die::~Die(local_2d);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int SentencePieceProcessor::GetPieceSize() const {
  CHECK_STATUS_OR_RETURN_DEFAULT(0);
  return model_->GetPieceSize();
}